

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

void ps_hints_t1stem3(PS_Hints hints,FT_UInt dimension,FT_Fixed *stems)

{
  FT_Fixed FVar1;
  FT_Fixed FVar2;
  FT_Int local_48 [2];
  FT_Int idx [3];
  FT_Int count;
  FT_Memory memory;
  PS_Dimension dim;
  FT_Fixed *pFStack_20;
  FT_Error error;
  FT_Fixed *stems_local;
  FT_UInt dimension_local;
  PS_Hints hints_local;
  
  if (hints->error == 0) {
    unique0x00012000 = hints->memory;
    stems_local._4_4_ = dimension;
    if (1 < dimension) {
      stems_local._4_4_ = (FT_UInt)(dimension != 0);
    }
    if (hints->hint_type == PS_HINT_TYPE_1) {
      pFStack_20 = stems;
      for (idx[1] = 0; idx[1] < 3; idx[1] = idx[1] + 1) {
        FVar1 = FT_RoundFix(*pFStack_20);
        FVar2 = FT_RoundFix(pFStack_20[1]);
        dim._4_4_ = ps_dimension_add_t1stem
                              (hints->dimension + stems_local._4_4_,(FT_Int)((ulong)FVar1 >> 0x10),
                               (FT_Int)((ulong)FVar2 >> 0x10),stack0xffffffffffffffc8,
                               local_48 + idx[1]);
        if (dim._4_4_ != 0) goto LAB_00316462;
        pFStack_20 = pFStack_20 + 2;
      }
      dim._4_4_ = ps_dimension_add_counter
                            (hints->dimension + stems_local._4_4_,local_48[0],local_48[1],idx[0],
                             stack0xffffffffffffffc8);
      if (dim._4_4_ == 0) {
        return;
      }
    }
    else {
      dim._4_4_ = 6;
    }
LAB_00316462:
    hints->error = dim._4_4_;
  }
  return;
}

Assistant:

static void
  ps_hints_t1stem3( PS_Hints   hints,
                    FT_UInt    dimension,
                    FT_Fixed*  stems )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !hints->error )
    {
      PS_Dimension  dim;
      FT_Memory     memory = hints->memory;
      FT_Int        count;
      FT_Int        idx[3];


      /* limit "dimension" to 0..1 */
      if ( dimension > 1 )
      {
        FT_TRACE0(( "ps_hints_t1stem3: invalid dimension (%d) used\n",
                    dimension ));
        dimension = ( dimension != 0 );
      }

      dim = &hints->dimension[dimension];

      /* there must be 6 elements in the 'stem' array */
      if ( hints->hint_type == PS_HINT_TYPE_1 )
      {
        /* add the three stems to our hints/masks table */
        for ( count = 0; count < 3; count++, stems += 2 )
        {
          error = ps_dimension_add_t1stem( dim,
                                           (FT_Int)FIXED_TO_INT( stems[0] ),
                                           (FT_Int)FIXED_TO_INT( stems[1] ),
                                           memory, &idx[count] );
          if ( error )
            goto Fail;
        }

        /* now, add the hints to the counters table */
        error = ps_dimension_add_counter( dim, idx[0], idx[1], idx[2],
                                          memory );
        if ( error )
          goto Fail;
      }
      else
      {
        FT_ERROR(( "ps_hints_t1stem3: called with invalid hint type\n" ));
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }
    }

    return;

  Fail:
    FT_ERROR(( "ps_hints_t1stem3: could not add counter stems to table\n" ));
    hints->error = error;
  }